

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O0

_Bool swap_commutative2(TCGArg *p1,TCGArg *p2)

{
  TCGArg TVar1;
  bool bVar2;
  _Bool _Var3;
  _Bool _Var4;
  _Bool _Var5;
  _Bool _Var6;
  TCGArg t;
  int sum;
  TCGArg *p2_local;
  TCGArg *p1_local;
  
  _Var3 = arg_is_const(*p1);
  _Var4 = arg_is_const(p1[1]);
  _Var5 = arg_is_const(*p2);
  _Var6 = arg_is_const(p2[1]);
  bVar2 = 0 < (int)((((uint)_Var4 + (uint)_Var3) - (uint)_Var5) - (uint)_Var6);
  if (bVar2) {
    TVar1 = *p1;
    *p1 = *p2;
    *p2 = TVar1;
    TVar1 = p1[1];
    p1[1] = p2[1];
    p2[1] = TVar1;
  }
  return bVar2;
}

Assistant:

static bool swap_commutative2(TCGArg *p1, TCGArg *p2)
{
    int sum = 0;
    sum += arg_is_const(p1[0]);
    sum += arg_is_const(p1[1]);
    sum -= arg_is_const(p2[0]);
    sum -= arg_is_const(p2[1]);
    if (sum > 0) {
        TCGArg t;
        t = p1[0], p1[0] = p2[0], p2[0] = t;
        t = p1[1], p1[1] = p2[1], p2[1] = t;
        return true;
    }
    return false;
}